

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

void make_int_list(vm_val_t *retval,int cnt,...)

{
  CVmObjPageEntry *pCVar1;
  char in_AL;
  vm_obj_id_t vVar2;
  void **ppvVar3;
  uint uVar4;
  undefined8 in_RCX;
  ulong uVar5;
  undefined8 in_RDX;
  ulong uVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t idx;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  vm_val_t ele;
  void **local_100;
  vm_val_t local_e8;
  void *local_d8 [4];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  idx = 0;
  local_d8[2] = (void *)in_RDX;
  local_d8[3] = (void *)in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  vVar2 = CVmObjList::create(0,(ulong)(uint)cnt);
  retval->typ = VM_OBJ;
  (retval->val).obj = vVar2;
  pCVar1 = G_obj_table_X.pages_[vVar2 >> 0xc];
  local_100 = &args[0].overflow_arg_area;
  uVar4 = 0x10;
  uVar6 = (ulong)(uint)cnt;
  if (cnt < 1) {
    uVar6 = idx;
  }
  for (; uVar6 != idx; idx = idx + 1) {
    uVar5 = (ulong)uVar4;
    if (uVar5 < 0x29) {
      uVar4 = uVar4 + 8;
      ppvVar3 = (void **)((long)local_d8 + uVar5);
    }
    else {
      ppvVar3 = local_100;
      local_100 = local_100 + 1;
    }
    local_e8.val.obj = *(undefined4 *)ppvVar3;
    local_e8.typ = VM_INT;
    CVmObjList::cons_set_element((CVmObjList *)(pCVar1 + (vVar2 & 0xfff)),idx,&local_e8);
  }
  return;
}

Assistant:

static void make_int_list(VMG_ vm_val_t *retval, int cnt, ...)
{
    /* create the list */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, cnt));
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* start the varargs scan */
    va_list args;
    va_start(args, cnt);

    /* add the elements */
    for (int i = 0 ; i < cnt ; ++i)
    {
        vm_val_t ele;
        ele.set_int(va_arg(args, int));
        lst->cons_set_element(i, &ele);
    }

    /* done with the varargs */
    va_end(args);
}